

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# write_ahead_log.cpp
# Opt level: O3

void __thiscall
duckdb::WriteAheadLog::WriteUpdate
          (WriteAheadLog *this,DataChunk *chunk,vector<unsigned_long,_true> *column_indexes)

{
  BinarySerializer *this_00;
  WriteAheadLogSerializer serializer;
  WriteAheadLogSerializer WStack_5c8;
  
  DataChunk::Verify(chunk);
  WriteAheadLogSerializer::WriteAheadLogSerializer(&WStack_5c8,this,UPDATE_TUPLE);
  this_00 = &WStack_5c8.serializer;
  (*WStack_5c8.serializer.super_Serializer._vptr_Serializer[2])(this_00,0x65,"column_indexes");
  Serializer::WriteValue<unsigned_long>(&this_00->super_Serializer,column_indexes);
  (*WStack_5c8.serializer.super_Serializer._vptr_Serializer[3])(this_00);
  Serializer::WriteProperty<duckdb::DataChunk>(&this_00->super_Serializer,0x66,"chunk",chunk);
  BinarySerializer::OnObjectEnd(this_00);
  ChecksumWriter::Flush(&WStack_5c8.checksum_writer);
  WriteAheadLogSerializer::~WriteAheadLogSerializer(&WStack_5c8);
  return;
}

Assistant:

void WriteAheadLog::WriteUpdate(DataChunk &chunk, const vector<column_t> &column_indexes) {
	D_ASSERT(chunk.size() > 0);
	D_ASSERT(chunk.ColumnCount() == 2);
	D_ASSERT(chunk.data[1].GetType().id() == LogicalType::ROW_TYPE);
	chunk.Verify();

	WriteAheadLogSerializer serializer(*this, WALType::UPDATE_TUPLE);
	serializer.WriteProperty(101, "column_indexes", column_indexes);
	serializer.WriteProperty(102, "chunk", chunk);
	serializer.End();
}